

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::ConeRecord1::Decode(ConeRecord1 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x37 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>(stream,&(this->super_EnvironmentRecord).m_ui16Length);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Index);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Padding);
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Height);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PeakAngle);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void ConeRecord1::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < CONE_RECORD_1_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> m_f32Height
           >> m_f32PeakAngle
           >> m_ui32Padding;
}